

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O0

void Omega_h::compute_ill_metric(Mesh *mesh,AdaptOpts *opts,Omega_h_Isotropy isotropy)

{
  Int IVar1;
  Omega_h_Isotropy isotropy_local;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    compute_ill_metric_dim<3>(mesh,opts,isotropy);
  }
  else {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 == 2) {
      compute_ill_metric_dim<2>(mesh,opts,isotropy);
    }
    else {
      IVar1 = Mesh::dim(mesh);
      if (IVar1 != 1) {
        fail("assertion %s failed at %s +%d\n","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_fix.cpp"
             ,0x4f);
      }
      compute_ill_metric_dim<1>(mesh,opts,isotropy);
    }
  }
  return;
}

Assistant:

static void compute_ill_metric(
    Mesh* mesh, AdaptOpts const& opts, Omega_h_Isotropy isotropy) {
  if (mesh->dim() == 3)
    compute_ill_metric_dim<3>(mesh, opts, isotropy);
  else if (mesh->dim() == 2)
    compute_ill_metric_dim<2>(mesh, opts, isotropy);
  else if (mesh->dim() == 1)
    compute_ill_metric_dim<1>(mesh, opts, isotropy);
  else
    OMEGA_H_NORETURN();
}